

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O0

void Abc_NtkFromFraig2_rec(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNode,Vec_Ptr_t *vNodeReprs)

{
  Abc_Aig_t *pMan;
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *p1;
  Abc_Obj_t *pRepr;
  Vec_Ptr_t *vNodeReprs_local;
  Abc_Obj_t *pNode_local;
  Abc_Ntk_t *pNtkNew_local;
  
  iVar1 = Abc_ObjFaninNum(pNode);
  if ((1 < iVar1) && (iVar1 = Abc_NodeIsTravIdCurrent(pNode), iVar1 == 0)) {
    Abc_NodeSetTravIdCurrent(pNode);
    iVar1 = Abc_ObjIsNode(pNode);
    if (iVar1 == 0) {
      __assert_fail("Abc_ObjIsNode( pNode )",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFraig.c"
                    ,0x1cb,"void Abc_NtkFromFraig2_rec(Abc_Ntk_t *, Abc_Obj_t *, Vec_Ptr_t *)");
    }
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(vNodeReprs,pNode->Id);
    if (pAVar2 == (Abc_Obj_t *)0x0) {
      pAVar2 = Abc_ObjFanin0(pNode);
      Abc_NtkFromFraig2_rec(pNtkNew,pAVar2,vNodeReprs);
      pAVar2 = Abc_ObjFanin1(pNode);
      Abc_NtkFromFraig2_rec(pNtkNew,pAVar2,vNodeReprs);
      pMan = (Abc_Aig_t *)pNtkNew->pManFunc;
      pAVar2 = Abc_ObjChild0Copy(pNode);
      p1 = Abc_ObjChild1Copy(pNode);
      pAVar2 = Abc_AigAnd(pMan,pAVar2,p1);
      (pNode->field_6).pCopy = pAVar2;
    }
    else {
      Abc_NtkFromFraig2_rec(pNtkNew,pAVar2,vNodeReprs);
      pAVar2 = Abc_ObjNotCond((pAVar2->field_6).pCopy,
                              *(uint *)&pAVar2->field_0x14 >> 7 & 1 ^
                              *(uint *)&pNode->field_0x14 >> 7 & 1);
      (pNode->field_6).pCopy = pAVar2;
    }
  }
  return;
}

Assistant:

void Abc_NtkFromFraig2_rec( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNode, Vec_Ptr_t * vNodeReprs )
{
    Abc_Obj_t * pRepr;
    // skip the PIs and constants
    if ( Abc_ObjFaninNum(pNode) < 2 )
        return;
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pNode );
    assert( Abc_ObjIsNode( pNode ) );
    // get the node's representative
    if ( (pRepr = (Abc_Obj_t *)Vec_PtrEntry(vNodeReprs, pNode->Id)) )
    {
        Abc_NtkFromFraig2_rec( pNtkNew, pRepr, vNodeReprs );
        pNode->pCopy = Abc_ObjNotCond( pRepr->pCopy, pRepr->fPhase ^ pNode->fPhase );
        return;
    }
    Abc_NtkFromFraig2_rec( pNtkNew, Abc_ObjFanin0(pNode), vNodeReprs );
    Abc_NtkFromFraig2_rec( pNtkNew, Abc_ObjFanin1(pNode), vNodeReprs );
    pNode->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild1Copy(pNode) );
}